

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uic.cpp
# Opt level: O0

bool __thiscall Uic::printDependencies(Uic *this)

{
  FILE *pFVar1;
  bool bVar2;
  ulong uVar3;
  DomUI *this_00;
  DomUI *this_01;
  DomCustomWidgets *pDVar4;
  const_iterator o;
  DomCustomWidget **ppDVar5;
  DomHeader *pDVar6;
  char *pcVar7;
  long in_FS_OFFSET;
  DomHeader *header;
  DomCustomWidget *customWidget;
  QList<DomCustomWidget_*> *__range2_1;
  DomCustomWidgets *customWidgets;
  DomInclude *incl;
  QList<DomInclude_*> *__range2;
  DomIncludes *includes;
  DomUI *ui;
  QString file_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  QList<DomCustomWidget_*> elementCustomWidget;
  QString file;
  const_iterator __end2;
  const_iterator __begin2;
  QList<DomInclude_*> incls;
  QXmlStreamReader reader;
  QFile f;
  QString fileName;
  undefined4 in_stack_fffffffffffffe78;
  FileHandleFlag in_stack_fffffffffffffe7c;
  QList<DomCustomWidget_*> *in_stack_fffffffffffffe80;
  QString *in_stack_fffffffffffffe98;
  QXmlStreamReader *reader_00;
  byte local_109;
  const_iterator local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  DomInclude **local_78;
  const_iterator local_70;
  const_iterator local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48 [2];
  uint local_34;
  Data *local_30;
  char16_t *local_28;
  char *local_20;
  char *local_18;
  char *local_10;
  char *local_8;
  
  local_8 = *(char **)(in_FS_OFFSET + 0x28);
  local_20 = (char *)0xaaaaaaaaaaaaaaaa;
  local_18 = (char *)0xaaaaaaaaaaaaaaaa;
  local_10 = (char *)0xaaaaaaaaaaaaaaaa;
  QString::QString((QString *)in_stack_fffffffffffffe80,
                   (QString *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  local_30 = (Data *)0xaaaaaaaaaaaaaaaa;
  local_28 = (char16_t *)0xaaaaaaaaaaaaaaaa;
  QFile::QFile((QFile *)&stack0xffffffffffffffd0);
  bVar2 = QString::isEmpty((QString *)0x1eaf20);
  if (bVar2) {
    in_stack_fffffffffffffe98 = _stdin;
    QFlags<QIODeviceBase::OpenModeFlag>::QFlags
              ((QFlags<QIODeviceBase::OpenModeFlag> *)in_stack_fffffffffffffe80,
               in_stack_fffffffffffffe7c);
    QFlags<QFileDevice::FileHandleFlag>::QFlags
              ((QFlags<QFileDevice::FileHandleFlag> *)in_stack_fffffffffffffe80,
               in_stack_fffffffffffffe7c);
    uVar3 = QFile::open((_IO_FILE *)&stack0xffffffffffffffd0,
                        (QFlags_conflict *)in_stack_fffffffffffffe98,
                        (QFlags_conflict *)(ulong)local_34);
    if ((uVar3 & 1) == 0) {
      local_109 = 0;
      goto LAB_001eb494;
    }
  }
  else {
    QFile::setFileName((QString *)&stack0xffffffffffffffd0);
    QFlags<QIODeviceBase::OpenModeFlag>::QFlags
              ((QFlags<QIODeviceBase::OpenModeFlag> *)in_stack_fffffffffffffe80,
               in_stack_fffffffffffffe7c);
    uVar3 = QFile::open((QFlags_conflict *)&stack0xffffffffffffffd0);
    if ((uVar3 & 1) == 0) {
      local_109 = 0;
      goto LAB_001eb494;
    }
  }
  reader_00 = (QXmlStreamReader *)0x0;
  local_48[0] = 0xaaaaaaaaaaaaaaaa;
  QXmlStreamReader::QXmlStreamReader((QXmlStreamReader *)local_48);
  QXmlStreamReader::setDevice((QIODevice *)local_48);
  this_00 = parseUiFile(reader_00);
  bVar2 = this_00 != (DomUI *)0x0;
  if (!bVar2) {
    local_109 = 0;
  }
  QXmlStreamReader::~QXmlStreamReader((QXmlStreamReader *)local_48);
  if (bVar2) {
    this_01 = (DomUI *)DomUI::elementIncludes(this_00);
    if (this_01 != (DomUI *)0x0) {
      local_60 = 0xaaaaaaaaaaaaaaaa;
      local_58 = 0xaaaaaaaaaaaaaaaa;
      local_50 = 0xaaaaaaaaaaaaaaaa;
      DomIncludes::elementInclude
                ((DomIncludes *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      local_68.i = (DomInclude **)0xaaaaaaaaaaaaaaaa;
      local_68 = QList<DomInclude_*>::begin((QList<DomInclude_*> *)in_stack_fffffffffffffe80);
      local_70.i = (DomInclude **)0xaaaaaaaaaaaaaaaa;
      local_70 = QList<DomInclude_*>::end((QList<DomInclude_*> *)in_stack_fffffffffffffe80);
      while( true ) {
        local_78 = local_70.i;
        bVar2 = QList<DomInclude_*>::const_iterator::operator!=(&local_68,local_70);
        if (!bVar2) break;
        QList<DomInclude_*>::const_iterator::operator*(&local_68);
        local_90 = 0xaaaaaaaaaaaaaaaa;
        local_88 = 0xaaaaaaaaaaaaaaaa;
        local_80 = 0xaaaaaaaaaaaaaaaa;
        DomInclude::text((DomInclude *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78)
                        );
        bVar2 = QString::isEmpty((QString *)0x1eb1ae);
        pFVar1 = _stdout;
        if (!bVar2) {
          QString::toLocal8Bit(in_stack_fffffffffffffe98);
          pcVar7 = QByteArray::constData((QByteArray *)0x1eb1ef);
          fprintf(pFVar1,"%s\n",pcVar7);
          QByteArray::~QByteArray((QByteArray *)0x1eb212);
        }
        QString::~QString((QString *)0x1eb227);
        QList<DomInclude_*>::const_iterator::operator++(&local_68);
      }
      QList<DomInclude_*>::~QList((QList<DomInclude_*> *)0x1eb254);
    }
    pDVar4 = DomUI::elementCustomWidgets(this_00);
    if (pDVar4 != (DomCustomWidgets *)0x0) {
      local_c0 = 0xaaaaaaaaaaaaaaaa;
      local_b8 = 0xaaaaaaaaaaaaaaaa;
      local_b0 = 0xaaaaaaaaaaaaaaaa;
      DomCustomWidgets::elementCustomWidget
                ((DomCustomWidgets *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      local_c8.i = (DomCustomWidget **)0xaaaaaaaaaaaaaaaa;
      local_c8 = QList<DomCustomWidget_*>::begin(in_stack_fffffffffffffe80);
      o = QList<DomCustomWidget_*>::end(in_stack_fffffffffffffe80);
      while (bVar2 = QList<DomCustomWidget_*>::const_iterator::operator!=(&local_c8,o), bVar2) {
        ppDVar5 = QList<DomCustomWidget_*>::const_iterator::operator*(&local_c8);
        pDVar6 = DomCustomWidget::elementHeader(*ppDVar5);
        if (pDVar6 != (DomHeader *)0x0) {
          DomHeader::text((DomHeader *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78)
                         );
          bVar2 = QString::isEmpty((QString *)0x1eb3b6);
          pFVar1 = _stdout;
          if (!bVar2) {
            QString::toLocal8Bit(in_stack_fffffffffffffe98);
            pcVar7 = QByteArray::constData((QByteArray *)0x1eb3f7);
            fprintf(pFVar1,"%s\n",pcVar7);
            QByteArray::~QByteArray((QByteArray *)0x1eb41a);
          }
          QString::~QString((QString *)0x1eb42f);
        }
        QList<DomCustomWidget_*>::const_iterator::operator++(&local_c8);
      }
      QList<DomCustomWidget_*>::~QList((QList<DomCustomWidget_*> *)0x1eb45e);
    }
    if (this_00 != (DomUI *)0x0) {
      DomUI::~DomUI(this_01);
      operator_delete(this_00,0x148);
    }
    local_109 = 1;
  }
LAB_001eb494:
  QFile::~QFile((QFile *)&stack0xffffffffffffffd0);
  QString::~QString((QString *)0x1eb4ae);
  if (*(char **)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(local_109 & 1);
}

Assistant:

bool Uic::printDependencies()
{
    QString fileName = opt.inputFile;

    QFile f;
    if (fileName.isEmpty()) {
        if (!f.open(stdin, QIODevice::ReadOnly))
            return false;
    } else {
        f.setFileName(fileName);
        if (!f.open(QIODevice::ReadOnly))
            return false;
    }

    DomUI *ui = nullptr;
    {
        QXmlStreamReader reader;
        reader.setDevice(&f);
        ui = parseUiFile(reader);
        if (!ui)
            return false;
    }

    if (DomIncludes *includes = ui->elementIncludes()) {
        const auto incls = includes->elementInclude();
        for (DomInclude *incl : incls) {
            QString file = incl->text();
            if (file.isEmpty())
                continue;

            fprintf(stdout, "%s\n", file.toLocal8Bit().constData());
        }
    }

    if (DomCustomWidgets *customWidgets = ui->elementCustomWidgets()) {
        const auto elementCustomWidget = customWidgets->elementCustomWidget();
        for (DomCustomWidget *customWidget : elementCustomWidget) {
            if (DomHeader *header = customWidget->elementHeader()) {
                QString file = header->text();
                if (file.isEmpty())
                    continue;

                fprintf(stdout, "%s\n", file.toLocal8Bit().constData());
            }
        }
    }

    delete ui;

    return true;
}